

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

VmConstant *
anon_unknown.dwarf_233176::CreateAlloca
          (ExpressionContext *ctx,VmModule *module,SynBase *source,TypeBase *type,char *suffix,
          bool trackUsers)

{
  uint uVar1;
  uint uniqueId;
  FunctionData *pFVar2;
  ScopeData *scope;
  Allocator *allocator;
  VmFunction *pVVar3;
  VariableData **ppVVar4;
  int iVar5;
  undefined4 extraout_var;
  VariableData *this;
  TypeRef *structType;
  VmConstant *pVVar6;
  ScopeData **ppSVar7;
  InplaceStr IVar8;
  SynIdentifier *name;
  undefined4 extraout_var_00;
  
  pFVar2 = module->currentFunction->function;
  ppSVar7 = &pFVar2->functionScope;
  if (pFVar2 == (FunctionData *)0x0) {
    ppSVar7 = &ctx->globalScope;
  }
  scope = *ppSVar7;
  uVar1 = ctx->unnamedVariableCount;
  ctx->unnamedVariableCount = uVar1 + 1;
  IVar8 = GetTemporaryName(ctx,uVar1,suffix);
  iVar5 = (*module->allocator->_vptr_Allocator[2])(module->allocator,0x50);
  name = (SynIdentifier *)CONCAT44(extraout_var,iVar5);
  (name->super_SynBase).typeID = 4;
  (name->super_SynBase).begin = (Lexeme *)0x0;
  (name->super_SynBase).end = (Lexeme *)0x0;
  (name->super_SynBase).pos.begin = (char *)0x0;
  (name->super_SynBase).pos.end = (char *)0x0;
  *(undefined8 *)((long)&(name->super_SynBase).pos.end + 2) = 0;
  *(undefined8 *)((long)&(name->super_SynBase).next + 2) = 0;
  (name->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003f6178;
  name->name = IVar8;
  iVar5 = (*module->allocator->_vptr_Allocator[2])(module->allocator,0x170);
  this = (VariableData *)CONCAT44(extraout_var_00,iVar5);
  uVar1 = type->alignment;
  uniqueId = ctx->uniqueVariableId;
  ctx->uniqueVariableId = uniqueId + 1;
  VariableData::VariableData(this,ctx->allocator,(SynBase *)0x0,scope,uVar1,type,name,0,uniqueId);
  this->isVmAlloca = true;
  this->offset = 0xffffffff;
  allocator = module->allocator;
  structType = ExpressionContext::GetReferenceType(ctx,this->type);
  pVVar6 = CreateConstantPointer(allocator,source,0,this,&structType->super_TypeBase,trackUsers);
  pVVar3 = module->currentFunction;
  uVar1 = (pVVar3->allocas).count;
  if (uVar1 == (pVVar3->allocas).max) {
    SmallArray<VariableData_*,_4U>::grow(&pVVar3->allocas,uVar1);
  }
  ppVVar4 = (pVVar3->allocas).data;
  if (ppVVar4 != (VariableData **)0x0) {
    uVar1 = (pVVar3->allocas).count;
    (pVVar3->allocas).count = uVar1 + 1;
    ppVVar4[uVar1] = this;
    return pVVar6;
  }
  __assert_fail("data",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x162,
                "void SmallArray<VariableData *, 4>::push_back(const T &) [T = VariableData *, N = 4]"
               );
}

Assistant:

VmConstant* CreateAlloca(ExpressionContext &ctx, VmModule *module, SynBase *source, TypeBase *type, const char *suffix, bool trackUsers)
	{
		ScopeData *scope = module->currentFunction->function ? module->currentFunction->function->functionScope : ctx.globalScope;

		InplaceStr name = GetTemporaryName(ctx, ctx.unnamedVariableCount++, suffix);

		SynIdentifier *nameIdentifier = new (module->get<SynIdentifier>()) SynIdentifier(name);

		VariableData *variable = new (module->get<VariableData>()) VariableData(ctx.allocator, NULL, scope, type->alignment, type, nameIdentifier, 0, ctx.uniqueVariableId++);

		variable->isVmAlloca = true;
		variable->offset = ~0u;

		VmConstant *value = CreateConstantPointer(module->allocator, source, 0, variable, ctx.GetReferenceType(variable->type), trackUsers);

		module->currentFunction->allocas.push_back(variable);

		return value;
	}